

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs_queue.c
# Opt level: O3

int pop_job(jobs_queue_t *q,job_t **j)

{
  ulong uVar1;
  job_t **ppjVar2;
  ulong uVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  
  pthread_mutex_lock((pthread_mutex_t *)q);
  uVar1 = q->high_bound;
  uVar6 = q->low_bound;
  if (uVar6 == uVar1) {
    q->high_bound = 0;
    q->low_bound = 0;
    *j = (job_t *)0x0;
    q->size = 0;
    iVar5 = 3;
    goto LAB_00103a6d;
  }
  if (uVar6 < 0x19000) {
    q->low_bound = uVar6 + 1;
    *j = q->array[uVar6];
    q->size = uVar1 - (uVar6 + 1);
  }
  else {
    iVar5 = 1;
    if (uVar6 != 0x19000) goto LAB_00103a6d;
    uVar6 = uVar1 - 0x19000;
    if (uVar6 == 0) {
      q->low_bound = 0;
LAB_00103a2e:
      ppjVar2 = (job_t **)realloc(q->array,0xc8000);
      if (ppjVar2 == (job_t **)0x0) {
        WriteLogPError("pop_job()");
        iVar5 = 2;
        goto LAB_00103a6d;
      }
      q->array = ppjVar2;
      q->capacity = 0x19000;
      sVar4 = q->low_bound;
    }
    else {
      uVar3 = 0x19000;
      do {
        q->array[uVar3 - 0x19000] = q->array[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      q->low_bound = 0;
      if (uVar6 < 0x19000) goto LAB_00103a2e;
      ppjVar2 = q->array;
      sVar4 = 0;
    }
    q->high_bound = uVar6;
    q->low_bound = sVar4 + 1;
    *j = ppjVar2[sVar4];
    q->size = uVar6 - (sVar4 + 1);
  }
  iVar5 = 0;
LAB_00103a6d:
  pthread_mutex_unlock((pthread_mutex_t *)q);
  return iVar5;
}

Assistant:

int pop_job(jobs_queue_t* q, job_t **j)
{
  pthread_mutex_lock(&q->lock);
  size_t size, i;
  job_t** ptr;

  if(q->low_bound == q->high_bound)
    {
      q->low_bound = q->high_bound = 0;
      *j = NULL;
#ifdef QUEUEDEBUG
      WriteLog("Queue '%s' is empty", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);

      return 3;//queue is empty
    }
  else if(q->low_bound < QUEUE_SIZE_RESERVE)
    {
      *j = q->array[(q->low_bound)++];
#ifdef QUEUEDEBUG
      WriteLog("Popped from queue '%s'", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);
      return 0;
    }
  else if(q->low_bound == QUEUE_SIZE_RESERVE)
    {
      size = (q->high_bound) - (q->low_bound);//size of the queue
      //moving all data to zero level and reset the low_bound to null
      for(i=0; i < size; i++)
        q->array[i]=q->array[(q->low_bound)++];
      q->low_bound = 0;//reset low_bound
      if(size < QUEUE_SIZE_RESERVE)
        {
          ptr=((job_t**)realloc(q->array,QUEUE_SIZE_RESERVE*sizeof(job_t*)));
          if(ptr == NULL)
            {
              WriteLogPError("pop_job()");
              pthread_mutex_unlock(&q->lock);
              return 2;
            }
          q->array = ptr;
          q->capacity=QUEUE_SIZE_RESERVE;
        }
      q->high_bound=size;//set high_bound to size
      *j = q->array[(q->low_bound)++];
#ifdef QUEUEDEBUG
      WriteLog("Popped from queue '%s'", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);
      return 0;
    }

  pthread_mutex_unlock(&q->lock);
  return 1;

}